

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

char * __thiscall pybind11::cpp_function::strdup_guard::operator()(strdup_guard *this,char *s)

{
  pointer *pppcVar1;
  iterator __position;
  char *t;
  char *local_18;
  
  local_18 = strdup(s);
  __position._M_current =
       (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
              ((vector<char*,std::allocator<char*>> *)this,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    pppcVar1 = &(this->strings).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return local_18;
}

Assistant:

char *operator()(const char *s) {
            auto t = strdup(s);
            strings.push_back(t);
            return t;
        }